

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parseCWL.cpp
# Opt level: O2

void processEnvironment(string *command,string *classification,CWLDef *data)

{
  pointer pcVar1;
  ulong uVar2;
  CWLDef *pCVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  ulong uVar7;
  __hashtable *__h;
  string *this;
  string local_a0;
  undefined4 local_80;
  CWLDef *local_78;
  string envName;
  string type;
  
  lVar6 = std::__cxx11::string::find((char)command,0x7d);
  if (lVar6 != -1) {
    std::__cxx11::string::substr((ulong)&envName,(ulong)command);
    uVar7 = std::__cxx11::string::find((char)classification,0x5c);
    if (uVar7 == 0xffffffffffffffff) {
      std::__cxx11::string::string((string *)&local_a0,(string *)&envName);
      local_80 = 0;
      std::
      _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
      ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                  *)&data->environments);
      this = &local_a0;
    }
    else {
      type._M_dataplus._M_p = (pointer)&type.field_2;
      type._M_string_length = 0;
      type.field_2._M_local_buf[0] = '\0';
      pcVar1 = (classification->_M_dataplus)._M_p;
      uVar2 = classification->_M_string_length;
      local_78 = data;
      do {
        uVar7 = uVar7 + 1;
        if (uVar2 <= uVar7) break;
        iVar5 = isalpha((int)pcVar1[uVar7]);
      } while (iVar5 != 0);
      std::__cxx11::string::substr((ulong)&local_a0,(ulong)classification);
      std::__cxx11::string::operator=((string *)&type,(string *)&local_a0);
      std::__cxx11::string::~string((string *)&local_a0);
      bVar4 = std::operator==(&type,"math");
      pCVar3 = local_78;
      if (bVar4) {
        std::__cxx11::string::string((string *)&local_a0,(string *)&envName);
        local_80 = 1;
        std::
        _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
        ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                  ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                    *)&pCVar3->environments);
      }
      else {
        bVar4 = std::operator==(&type,"tabular");
        if (bVar4) {
          std::__cxx11::string::string((string *)&local_a0,(string *)&envName);
          local_80 = 4;
          std::
          _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
          ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                    ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                      *)&pCVar3->environments);
        }
        else {
          bVar4 = std::operator==(&type,"array");
          if (bVar4) {
            std::__cxx11::string::string((string *)&local_a0,(string *)&envName);
            local_80 = 2;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&pCVar3->environments);
          }
          else {
            std::__cxx11::string::string((string *)&local_a0,(string *)&envName);
            local_80 = 0;
            std::
            _Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
            ::_M_emplace<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>
                      ((_Hashtable<std::__cxx11::string,std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>,std::allocator<std::pair<std::__cxx11::string_const,LConfig::LatexConfig::CWL::EnvKind>>,std::__detail::_Select1st,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,false,true>>
                        *)&pCVar3->environments);
          }
        }
      }
      std::__cxx11::string::~string((string *)&local_a0);
      this = &type;
    }
    std::__cxx11::string::~string((string *)this);
    std::__cxx11::string::~string((string *)&envName);
  }
  return;
}

Assistant:

void processEnvironment (string &command, string &classification, CWLDef &data) {
    auto envNameEnd = command.find('}');
    if (envNameEnd == string::npos) { return; }
    string envName = command.substr(7, envNameEnd - 7); // command == \begin{name}

    auto typeStart = classification.find('\\');
    if (typeStart == string::npos) {
        data.environments.insert({envName, CWL::EnvKind::General});
    } else {
        string type {};
        auto i = ++typeStart;
        for (; i < classification.size(); i++) {
            if (!isalpha(classification[i])) { break; }
        }

        type = classification.substr(typeStart, i - typeStart);

        if (type == "math") {
            data.environments.insert({envName, CWL::EnvKind::Math});
        } else if (type == "tabular") {
            data.environments.insert({envName, CWL::EnvKind::Tabular});
        } else if (type == "array") {
            data.environments.insert({envName, CWL::EnvKind::Array});
        } else {
            data.environments.insert({envName, CWL::EnvKind::General});
        }
    }
}